

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::buffer_sub_data(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLuint buffer;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindBuffer(&pNStack_10->super_CallLogWrapper,0x8892,local_14);
  glu::CallLogWrapper::glBufferData(&pNStack_10->super_CallLogWrapper,0x8892,10,(void *)0x0,0x88e0);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_ENUM is generated if target is not GL_ARRAY_BUFFER or GL_ELEMENT_ARRAY_BUFFER."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glBufferSubData(&pNStack_10->super_CallLogWrapper,0xffffffff,1,1,(void *)0x0)
  ;
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_OPERATION is generated if the reserved buffer object name 0 is bound to target."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glBindBuffer(&pNStack_10->super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBufferSubData(&pNStack_10->super_CallLogWrapper,0x8892,1,1,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x502);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_OPERATION is generated if the buffer object being updated is mapped.",
             &local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glBindBuffer(&pNStack_10->super_CallLogWrapper,0x8892,local_14);
  glu::CallLogWrapper::glMapBufferRange(&pNStack_10->super_CallLogWrapper,0x8892,0,5,1);
  NegativeTestContext::expectError(pNStack_10,0);
  glu::CallLogWrapper::glBufferSubData(&pNStack_10->super_CallLogWrapper,0x8892,1,1,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x502);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteBuffers(&pNStack_10->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void buffer_sub_data (NegativeTestContext& ctx)
{
	GLuint buffer = 0x1234;
	ctx.glGenBuffers(1, &buffer);
	ctx.glBindBuffer(GL_ARRAY_BUFFER, buffer);
	ctx.glBufferData(GL_ARRAY_BUFFER, 10, 0, GL_STREAM_DRAW);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_ARRAY_BUFFER or GL_ELEMENT_ARRAY_BUFFER.");
	ctx.glBufferSubData(-1, 1, 1, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the reserved buffer object name 0 is bound to target.");
	ctx.glBindBuffer(GL_ARRAY_BUFFER, 0);
	ctx.glBufferSubData(GL_ARRAY_BUFFER, 1, 1, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the buffer object being updated is mapped.");
	ctx.glBindBuffer(GL_ARRAY_BUFFER, buffer);
	ctx.glMapBufferRange(GL_ARRAY_BUFFER, 0, 5, GL_MAP_READ_BIT);
	ctx.expectError(GL_NO_ERROR);
	ctx.glBufferSubData(GL_ARRAY_BUFFER, 1, 1, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteBuffers(1, &buffer);
}